

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall
inja::BlockStatementNode::BlockStatementNode
          (BlockStatementNode *this,BlockNode *parent,string *name,size_t pos)

{
  (this->super_StatementNode).super_AstNode.pos = pos;
  (this->super_StatementNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019c770;
  ::std::__cxx11::string::string((string *)&this->name,(string *)name);
  (this->block).super_AstNode.pos = 0;
  (this->block).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019c120;
  (this->block).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parent = parent;
  return;
}

Assistant:

explicit BlockStatementNode(BlockNode* const parent, const std::string& name, size_t pos): StatementNode(pos), name(name), parent(parent) {}